

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataconvertergenerator.cpp
# Opt level: O2

string * __thiscall
DataConverterGenerator::functionToString_abi_cxx11_
          (string *__return_storage_ptr__,DataConverterGenerator *this,int converterIndex)

{
  bool bVar1;
  undefined4 in_register_00000014;
  string indexString;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p._0_4_ = converterIndex + 1;
  boost::lexical_cast<std::__cxx11::string,int>
            (&local_88,(boost *)&local_c8,(int *)CONCAT44(in_register_00000014,converterIndex));
  getConverterFunction_abi_cxx11_(&local_c8,this,converterIndex);
  bVar1 = std::operator==(&local_c8,"deg_to_rad");
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar1) {
    std::operator+(&local_68,"      mux",&local_88);
    std::operator+(&local_48,&local_68,".get(i) = mux");
    std::operator+(&local_a8,&local_48,&local_88);
    std::operator+(&local_c8,&local_a8,".get(i).asDouble() / (180/3.1415926);\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = getConverterVerbose(this,converterIndex);
    if (!bVar1) goto LAB_00113788;
    std::operator+(&local_a8,"      std::cout << \"value on index \" << i << \": \" << mux",
                   &local_88);
    std::operator+(&local_c8,&local_a8,".get(i).asDouble() << std::endl;\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    getConverterFunction_abi_cxx11_(&local_c8,this,converterIndex);
    bVar1 = std::operator==(&local_c8,"none_double");
    std::__cxx11::string::~string((string *)&local_c8);
    if (!bVar1) {
      getConverterFunction_abi_cxx11_(&local_c8,this,converterIndex);
      bVar1 = std::operator==(&local_c8,"none");
      std::__cxx11::string::~string((string *)&local_c8);
      if (bVar1) {
        bVar1 = getConverterVerbose(this,converterIndex);
        if (bVar1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      goto LAB_00113788;
    }
    std::operator+(&local_68,"      mux",&local_88);
    std::operator+(&local_48,&local_68,".get(i) = mux");
    std::operator+(&local_a8,&local_48,&local_88);
    std::operator+(&local_c8,&local_a8,".get(i).asDouble();\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = getConverterVerbose(this,converterIndex);
    if (!bVar1) goto LAB_00113788;
    std::operator+(&local_a8,"      std::cout << \"value on index \" << i << \": \" << mux",
                   &local_88);
    std::operator+(&local_c8,&local_a8,".get(i).asDouble() << std::endl;\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
LAB_00113788:
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string DataConverterGenerator::functionToString(int converterIndex) { // >data[6] / (180/3.1415926));
  std::string functionCode;
  std::string indexString = boost::lexical_cast<std::string>(converterIndex + 1);

  if(getConverterFunction(converterIndex) == "deg_to_rad") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble() / (180/3.1415926);\n";
    if(getConverterVerbose(converterIndex)) {
      functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
    }
  } else if(getConverterFunction(converterIndex) == "none_double") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble();\n";
      if(getConverterVerbose(converterIndex)) {
        functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
      }
    } else if(getConverterFunction(converterIndex) == "none") {
        // do nothing
        if(getConverterVerbose(converterIndex)) {
          functionCode += "      std::cout << \"Dummy break. Sorry for my laziness.\" << std::endl;\n";
        }
        functionCode += "      break;\n";
      }

  return functionCode;
 }